

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O1

Vec_Ptr_t * If_ManReverseOrder(If_Man_t *p)

{
  size_t __size;
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  void *__s;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  
  __size = (long)p->nLevelMax * 8 + 8;
  __s = malloc(__size);
  memset(__s,0,__size);
  pVVar5 = p->vObjs;
  iVar11 = pVVar5->nSize;
  if (0 < iVar11) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)pVVar5->pArray[lVar4];
      uVar8 = *puVar1 >> 0xd;
      if ((uint)p->nLevelMax < uVar8) {
        __assert_fail("pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifUtil.c"
                      ,0x176,"Vec_Ptr_t *If_ManReverseOrder(If_Man_t *)");
      }
      *(undefined8 *)(puVar1 + 0x10) = *(undefined8 *)((long)__s + (ulong)uVar8 * 8);
      *(uint **)((long)__s + (ulong)uVar8 * 8) = puVar1;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vObjs;
      iVar11 = pVVar5->nSize;
    } while (lVar4 < iVar11);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar11 - 1U) {
    iVar7 = iVar11;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar5->pArray = ppvVar6;
  lVar4 = (long)p->nLevelMax;
  if (-1 < (long)p->nLevelMax) {
    do {
      pvVar9 = *(void **)((long)__s + lVar4 * 8);
      if (pvVar9 != (void *)0x0) {
        lVar10 = (long)pVVar5->nSize;
        uVar8 = pVVar5->nCap;
        ppvVar6 = pVVar5->pArray;
        do {
          if ((uint)lVar10 == uVar8) {
            if ((int)uVar8 < 0x10) {
              if (ppvVar6 == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(ppvVar6,0x80);
              }
              uVar8 = 0x10;
            }
            else {
              uVar3 = uVar8 * 2;
              if (SBORROW4(uVar8,uVar3) != 0 < (int)uVar8) {
                uVar8 = uVar3;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar3 << 3);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar3 << 3);
                }
              }
            }
          }
          ppvVar6[lVar10] = pvVar9;
          lVar10 = lVar10 + 1;
          pvVar9 = *(void **)((long)pvVar9 + 0x40);
        } while (pvVar9 != (void *)0x0);
        pVVar5->nSize = (int)lVar10;
        pVVar5->nCap = uVar8;
        pVVar5->pArray = ppvVar6;
      }
      bVar2 = 0 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * If_ManReverseOrder( If_Man_t * p )
{
    Vec_Ptr_t * vOrder;
    If_Obj_t * pObj, ** ppStore;
    int i;
    // allocate place to store the nodes
    ppStore = ABC_ALLOC( If_Obj_t *, p->nLevelMax + 1 );
    memset( ppStore, 0, sizeof(If_Obj_t *) * (p->nLevelMax + 1) );
    // add the nodes
    If_ManForEachObj( p, pObj, i )
    {
        assert( pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax );
        pObj->pCopy = (char *)ppStore[pObj->Level]; 
        ppStore[pObj->Level] = pObj;
    }
    vOrder = Vec_PtrAlloc( If_ManObjNum(p) );
    for ( i = p->nLevelMax; i >= 0; i-- )
        for ( pObj = ppStore[i]; pObj; pObj = (If_Obj_t *)pObj->pCopy )
            Vec_PtrPush( vOrder, pObj );
    ABC_FREE( ppStore );
    // print the order
//    Vec_PtrForEachEntry( If_Obj_t *, vOrder, pObj, i )
//        Abc_Print( 1, "Obj %2d   Type %d  Level = %d\n", pObj->Id, pObj->Type, pObj->Level );
    return vOrder;
}